

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicPrimAttr<unsigned_long>
          (AsciiParser *this,bool array_qual,string *primattr_name,Attribute *out_attr)

{
  bool bVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  pointer pPVar5;
  int iVar6;
  undefined7 in_register_00000031;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  byte bVar9;
  optional<unsigned_long> value_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> value;
  ostringstream ss_e_2;
  Attribute attr;
  AttrMeta meta;
  string local_700;
  int local_6dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_6b8;
  storage_union local_698;
  undefined8 *local_688;
  undefined1 local_680;
  undefined1 local_678 [32];
  string local_658 [3];
  ios_base local_5e8 [264];
  undefined1 local_4e0 [40];
  _Alloc_hider local_4b8;
  size_type local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  storage_union local_498;
  vtable_type *local_488;
  bool local_480;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_478;
  bool local_460;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_458;
  AttrMetas AStack_440;
  storage_union local_238;
  undefined1 *local_228;
  undefined1 local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined1 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  _Rb_tree_node_base local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  iVar6 = (int)CONCAT71(in_register_00000031,array_qual);
  local_4e0._0_8_ = local_4e0 + 0x10;
  local_4e0._8_8_ = 0;
  local_4e0[0x10] = '\0';
  local_4e0._32_4_ = Varying;
  local_4e0[0x24] = false;
  local_4b8._M_p = (pointer)&local_4a8;
  local_4b0 = 0;
  local_4a8._M_local_buf[0] = '\0';
  local_488 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_498.dynamic = (void *)0x0;
  local_480 = false;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_460 = false;
  AStack_440.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_440.elementSize.has_value_ = false;
  AStack_440.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_440.hidden.has_value_ = false;
  AStack_440.hidden.contained = (storage_t<bool>)0x0;
  AStack_440.comment.has_value_ = false;
  AStack_440.weight.contained = (storage_t<double>)0x0;
  AStack_440.connectability.has_value_ = false;
  AStack_440.bindMaterialAs.contained._16_8_ = 0;
  AStack_440.bindMaterialAs.contained._24_8_ = 0;
  AStack_440.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.bindMaterialAs.contained._8_8_ = 0;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_440.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.comment.contained._8_8_ = 0;
  AStack_440.comment.contained._16_8_ = 0;
  AStack_440.comment.contained._24_8_ = 0;
  AStack_440.comment.contained._32_8_ = 0;
  AStack_440.comment.contained._40_8_ = 0;
  AStack_440.customData.has_value_ = false;
  AStack_440.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.customData.contained._8_8_ = 0;
  AStack_440.customData.contained._16_8_ = 0;
  AStack_440.customData.contained._24_8_ = 0;
  AStack_440.customData.contained._32_8_ = 0;
  AStack_440.customData.contained._40_8_ = 0;
  AStack_440.weight.has_value_ = false;
  AStack_440.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.connectability.contained._8_8_ = 0;
  AStack_440.connectability.contained._16_8_ = 0;
  AStack_440.connectability.contained._24_8_ = 0;
  AStack_440.outputName.has_value_ = false;
  AStack_440.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.outputName.contained._8_8_ = 0;
  AStack_440.outputName.contained._16_8_ = 0;
  AStack_440.outputName.contained._24_8_ = 0;
  AStack_440.renderType.has_value_ = false;
  AStack_440.sdrMetadata.has_value_ = false;
  AStack_440.renderType.contained._16_8_ = 0;
  AStack_440.renderType.contained._24_8_ = 0;
  AStack_440.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.renderType.contained._8_8_ = 0;
  AStack_440.displayName.has_value_ = false;
  AStack_440.sdrMetadata.contained._32_8_ = 0;
  AStack_440.sdrMetadata.contained._40_8_ = 0;
  AStack_440.sdrMetadata.contained._16_8_ = 0;
  AStack_440.sdrMetadata.contained._24_8_ = 0;
  AStack_440.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.sdrMetadata.contained._8_8_ = 0;
  AStack_440.displayGroup.has_value_ = false;
  AStack_440.displayName.contained._16_8_ = 0;
  AStack_440.displayName.contained._24_8_ = 0;
  AStack_440.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.displayName.contained._8_8_ = 0;
  AStack_440.bindMaterialAs.has_value_ = false;
  AStack_440.displayGroup.contained._16_8_ = 0;
  AStack_440.displayGroup.contained._24_8_ = 0;
  AStack_440.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.displayGroup.contained._8_8_ = 0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  AStack_440.interpolation.has_value_ = false;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_440.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_440.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_440.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_688 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_698.dynamic = (void *)0x0;
  local_680 = 0;
  local_678._0_8_ = (pointer)0x0;
  local_678[8] = 0;
  local_678._9_7_ = 0;
  local_678[0x10] = 0;
  local_678._17_8_ = 0;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar6 == 0) {
    local_6d8._M_dataplus._M_p = local_6d8._M_dataplus._M_p & 0xffffffffffffff00;
    local_6d8._M_string_length = 0;
    bVar1 = ReadBasicType(this,(optional<unsigned_long> *)&local_6d8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"ParseBasicPrimAttr",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<(&local_238,0xe2f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      local_700.field_2._M_allocated_capacity._0_4_ = 0x746e6975;
      local_700.field_2._M_allocated_capacity._4_2_ = 0x3436;
      local_700._M_string_length = 6;
      local_700.field_2._M_local_buf[6] = '\0';
      local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
      plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,0x3ef26a);
      pPVar5 = (pointer)(plVar3 + 2);
      if ((pointer)*plVar3 == pPVar5) {
        local_658[0].field_2._0_8_ = (pPVar5->_prim_part)._M_dataplus._M_p;
        local_658[0].field_2._8_8_ = plVar3[3];
        local_658[0]._M_dataplus._M_p = (pointer)&local_658[0].field_2;
      }
      else {
        local_658[0].field_2._0_8_ = (pPVar5->_prim_part)._M_dataplus._M_p;
        local_658[0]._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_658[0]._M_string_length = plVar3[1];
      *plVar3 = (long)pPVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_238,local_658[0]._M_dataplus._M_p,
                          local_658[0]._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658[0]._M_dataplus._M_p != &local_658[0].field_2) {
        operator_delete(local_658[0]._M_dataplus._M_p,
                        (ulong)(local_658[0].field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_700._M_dataplus._M_p != &local_700.field_2) {
        operator_delete(local_700._M_dataplus._M_p,
                        CONCAT17(local_700.field_2._M_local_buf[7],
                                 CONCAT16(local_700.field_2._M_local_buf[6],
                                          CONCAT24(local_700.field_2._M_allocated_capacity._4_2_,
                                                   local_700.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,local_658);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658[0]._M_dataplus._M_p != &local_658[0].field_2) {
        operator_delete(local_658[0]._M_dataplus._M_p,
                        (ulong)(local_658[0].field_2._M_allocated_capacity + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      ::std::ios_base::~ios_base((ios_base *)&uStack_1c8);
      bVar1 = false;
      goto LAB_00389500;
    }
    bVar9 = (byte)local_6d8._M_dataplus._M_p;
    if ((byte)local_6d8._M_dataplus._M_p == 1) {
      local_228 = linb::any::vtable_for_type<unsigned_long>()::table;
      local_238.dynamic = (void *)local_6d8._M_string_length;
      linb::any::swap((any *)&local_238,(any *)&local_698);
      if (local_228 != (undefined1 *)0x0) {
        (**(code **)(local_228 + 0x20))(&local_238);
      }
    }
    bVar9 = bVar9 ^ 1;
  }
  else {
    bVar1 = MaybeNone(this);
    if (bVar1) {
      bVar9 = 0;
    }
    else {
      local_6b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_6b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_6b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = ParseBasicTypeArray<unsigned_long>(this,&local_6b8);
      if (bVar2) {
        linb::any::operator=((any *)&local_698,&local_6b8);
      }
      else {
        local_6dc = iVar6;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"ParseBasicPrimAttr",0x12);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(&local_238,0xdf9);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_700,"Failed to parse Primtive Attribute {} type = {}[]","");
        local_6d8.field_2._M_allocated_capacity._0_4_ = 0x746e6975;
        local_6d8.field_2._M_allocated_capacity._4_2_ = 0x3436;
        local_6d8._M_string_length = 6;
        local_6d8.field_2._M_local_buf[6] = '\0';
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  (local_658,(fmt *)&local_700,primattr_name,&local_6d8,in_R8);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_238,local_658[0]._M_dataplus._M_p,
                            local_658[0]._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658[0]._M_dataplus._M_p != &local_658[0].field_2) {
          operator_delete(local_658[0]._M_dataplus._M_p,
                          (ulong)(local_658[0].field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p,
                          CONCAT17(local_6d8.field_2._M_local_buf[7],
                                   CONCAT16(local_6d8.field_2._M_local_buf[6],
                                            CONCAT24(local_6d8.field_2._M_allocated_capacity._4_2_,
                                                     local_6d8.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_dataplus._M_p != &local_700.field_2) {
          operator_delete(local_700._M_dataplus._M_p,
                          CONCAT17(local_700.field_2._M_local_buf[7],
                                   CONCAT16(local_700.field_2._M_local_buf[6],
                                            CONCAT24(local_700.field_2._M_allocated_capacity._4_2_,
                                                     local_700.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,local_658);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658[0]._M_dataplus._M_p != &local_658[0].field_2) {
          operator_delete(local_658[0]._M_dataplus._M_p,
                          (ulong)(local_658[0].field_2._M_allocated_capacity + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        ::std::ios_base::~ios_base((ios_base *)&uStack_1c8);
        array_qual = SUB41(local_6dc,0);
      }
      if (local_6b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_6b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      bVar1 = false;
      bVar9 = 0;
      if (!bVar2) goto LAB_00389500;
    }
  }
  local_70._M_left = &local_70;
  local_238.dynamic = (void *)(((ulong)local_238.dynamic >> 8 & 0xffffff) << 8);
  local_238._8_1_ = 0;
  local_238._12_4_ = 0;
  local_228 = (undefined1 *)((ulong)local_228 & 0xffffffffffff0000);
  local_220 = 0;
  local_1a8 = 0;
  local_1a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_70._M_color = _S_red;
  local_70._M_parent = (_Base_ptr)0x0;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e8 = 0;
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1b0 = 0;
  local_178 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_160 = 0;
  uStack_158 = 0;
  local_150 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_70._M_right = local_70._M_left;
  bVar1 = ParseAttrMeta(this,(AttrMeta *)&local_238);
  if (bVar1) {
    AttrMetas::operator=(&AStack_440,(AttrMetas *)&local_238);
    if (bVar9 == 0) {
      Attribute::set_var((Attribute *)local_4e0,(PrimVar *)&local_698);
    }
    else {
      Attribute::set_value<tinyusdz::value::ValueBlock>
                ((Attribute *)local_4e0,(ValueBlock *)&local_6d8);
      local_480 = true;
      if (array_qual == false) {
        local_658[0]._M_string_length = 6;
        local_658[0].field_2._0_7_ = 0x3436746e6975;
        local_658[0]._M_dataplus._M_p = (pointer)&local_658[0].field_2;
        ::std::__cxx11::string::_M_assign((string *)&local_4b8);
        uVar7 = local_658[0].field_2._M_allocated_capacity;
        _Var8._M_p = local_658[0]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658[0]._M_dataplus._M_p != &local_658[0].field_2) goto LAB_003893e5;
      }
      else {
        local_700.field_2._M_allocated_capacity._0_4_ = 0x746e6975;
        local_700.field_2._M_allocated_capacity._4_2_ = 0x3436;
        local_700._M_string_length = 6;
        local_700.field_2._M_local_buf[6] = '\0';
        local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_700);
        pPVar5 = (pointer)(plVar3 + 2);
        if ((pointer)*plVar3 == pPVar5) {
          local_658[0].field_2._0_8_ = (pPVar5->_prim_part)._M_dataplus._M_p;
          local_658[0].field_2._8_8_ = plVar3[3];
          local_658[0]._M_dataplus._M_p = (pointer)&local_658[0].field_2;
        }
        else {
          local_658[0].field_2._0_8_ = (pPVar5->_prim_part)._M_dataplus._M_p;
          local_658[0]._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_658[0]._M_string_length = plVar3[1];
        *plVar3 = (long)pPVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ::std::__cxx11::string::_M_assign((string *)&local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658[0]._M_dataplus._M_p != &local_658[0].field_2) {
          operator_delete(local_658[0]._M_dataplus._M_p,
                          (ulong)(local_658[0].field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_dataplus._M_p != &local_700.field_2) {
          uVar7 = (pointer)CONCAT17(local_700.field_2._M_local_buf[7],
                                    CONCAT16(local_700.field_2._M_local_buf[6],
                                             CONCAT24(local_700.field_2._M_allocated_capacity._4_2_,
                                                      local_700.field_2._M_allocated_capacity._0_4_)
                                            ));
          _Var8._M_p = local_700._M_dataplus._M_p;
LAB_003893e5:
          operator_delete(_Var8._M_p,
                          (ulong)((long)&(((pointer)uVar7)->_prim_part)._M_dataplus._M_p + 1));
        }
      }
    }
    ::std::__cxx11::string::operator=((string *)out_attr,(string *)local_4e0);
    out_attr->_variability = local_4e0._32_4_;
    out_attr->_varying_authored = local_4e0[0x24];
    ::std::__cxx11::string::operator=((string *)&out_attr->_type_name,(string *)&local_4b8);
    linb::any::operator=((any *)&out_attr->_var,(any *)&local_498);
    (out_attr->_var)._blocked = local_480;
    local_658[0].field_2._0_8_ =
         (out_attr->_var)._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (out_attr->_var)._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_658[0]._M_dataplus._M_p =
         (pointer)(out_attr->_var)._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_658[0]._M_string_length =
         (size_type)
         (out_attr->_var)._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (out_attr->_var)._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_478.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (out_attr->_var)._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                           local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_658);
    (out_attr->_var)._ts._dirty = local_460;
    local_658[0].field_2._0_8_ =
         (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_658[0]._M_dataplus._M_p =
         (pointer)(out_attr->_paths).
                  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_658[0]._M_string_length =
         (size_type)
         (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_finish._1_7_,
                           local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_finish._0_1_);
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_658);
    AttrMetas::operator=(&out_attr->_metas,&AStack_440);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_658,"ParseBasicPrimAttr",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_658,0xe43);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_658,"Failed to parse Attribute meta.",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_700);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,
                      CONCAT17(local_700.field_2._M_local_buf[7],
                               CONCAT16(local_700.field_2._M_local_buf[6],
                                        CONCAT24(local_700.field_2._M_allocated_capacity._4_2_,
                                                 local_700.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
    ::std::ios_base::~ios_base(local_5e8);
  }
  AttrMetas::~AttrMetas((AttrMetas *)&local_238);
LAB_00389500:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_678);
  if (local_688 != (undefined8 *)0x0) {
    (*(code *)local_688[4])(&local_698);
  }
  AttrMetas::~AttrMetas(&AStack_440);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_458);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_478);
  if (local_488 != (vtable_type *)0x0) {
    (*local_488->destroy)(&local_498);
    local_488 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_p != &local_4a8) {
    operator_delete(local_4b8._M_p,
                    CONCAT71(local_4a8._M_allocated_capacity._1_7_,local_4a8._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_4e0._0_8_ != local_4e0 + 0x10) {
    operator_delete((void *)local_4e0._0_8_,CONCAT71(local_4e0._17_7_,local_4e0[0x10]) + 1);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ParseBasicPrimAttr(bool array_qual,
                                     const std::string &primattr_name,
                                     Attribute *out_attr) {
  Attribute attr;
  primvar::PrimVar var;
  bool blocked{false};

  if (array_qual) {
    if (MaybeNone()) {
    } else {
      std::vector<T> value;
      if (!ParseBasicTypeArray(&value)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to parse Primtive Attribute {} type = {}[]", primattr_name,
                              std::string(value::TypeTraits<T>::type_name())));
      }

      // Empty array allowed.
      DCOUT("Got it: primatrr " << primattr_name << ", ty = " + std::string(value::TypeTraits<T>::type_name()) +
            ", sz = " + std::to_string(value.size()));
      var.set_value(value);
    }

#if 0
  // FIXME: Disable duplicated parsing attribute connection here, since parsing attribute connection will be handled in ParsePrimProps().
  } else if (hasConnect(primattr_name)) {
    std::string value;  // TODO: Use Path
    if (!ReadPathIdentifier(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse path identifier.");
    }

    // validate.
    Path connectionPath = pathutil::FromString(value);
    if (!connectionPath.is_valid()) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid connectionPath: {}.", value));
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    Path base_prim_path(GetCurrentPrimPath(), "");
    Path abs_path;
    if (!pathutil::ResolveRelativePath(base_prim_path, connectionPath,
                                       &abs_path)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid relative Path: {}.", value));
    }

    // TODO: Use Path
    var.set_value(abs_path.full_path_name());

    // Check if attribute metadatum is not authored.
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      PUSH_ERROR_AND_RETURN(fmt::format("Attribute connection cannot have attribute metadataum: {}", primattr_name));
    }

#endif
  } else {
    nonstd::optional<T> value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse " +
                            std::string(value::TypeTraits<T>::type_name()));
    }

    if (value) {
      DCOUT("ParseBasicPrimAttr: " << value::TypeTraits<T>::type_name() << " = "
                                   << (*value));

      var.set_value(value.value());

    } else {
      blocked = true;
      // std::cout << "ParseBasicPrimAttr: " <<
      // value::TypeTraits<T>::type_name()
      //           << " = None\n";
    }
  }

  // optional: attribute meta.
  AttrMeta meta;
  if (!ParseAttrMeta(&meta)) {
    PUSH_ERROR_AND_RETURN("Failed to parse Attribute meta.");
  }
  attr.metas() = meta;

  if (blocked) {
    // There is still have a type for ValueBlock.
    value::ValueBlock noneval;
    attr.set_value(noneval);
    attr.set_blocked(true);
    if (array_qual) {
      attr.set_type_name(value::TypeTraits<T>::type_name() + "[]");
    } else {
      attr.set_type_name(value::TypeTraits<T>::type_name());
    }
  } else {
    attr.set_var(std::move(var));
  }

  (*out_attr) = std::move(attr);

  return true;
}